

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createStore(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  Use *pUVar1;
  iterator iVar2;
  undefined8 *puVar3;
  PSNode *node;
  PSNodesSeq *pPVar4;
  Value *valOp;
  PSNode *op2;
  Value *local_30;
  PSNode *local_28;
  PSNode *local_20;
  
  pUVar1 = llvm::User::getOperandList((User *)Inst);
  local_30 = *(Value **)pUVar1;
  if (local_30[0x10] == (Value)0x40) {
    iVar2 = std::
            _Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(this + 0x188),&local_30);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
        ._M_cur == (__node_type *)0x0) {
      puVar3 = &UNKNOWN_MEMORY;
    }
    else {
      puVar3 = *(undefined8 **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                       ._M_cur + 0x10);
    }
    local_20 = (PSNode *)*puVar3;
  }
  else {
    local_20 = getOperand(this,local_30);
  }
  pUVar1 = llvm::User::getOperandList((User *)Inst);
  local_28 = getOperand(this,*(Value **)(pUVar1 + 0x20));
  node = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
                   ((PointerGraph *)this,&local_20,&local_28);
  pPVar4 = addNode(this,(Value *)Inst,node);
  return pPVar4;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createStore(const llvm::Instruction *Inst) {
    using namespace llvm;
    const Value *valOp = Inst->getOperand(0);

    PSNode *op1;
    if (isa<AtomicRMWInst>(valOp)) {
        // we store the old value of AtomicRMW
        auto it = nodes_map.find(valOp);
        if (it == nodes_map.end()) {
            op1 = UNKNOWN_MEMORY;
        } else {
            op1 = it->second.getFirst();
            assert(op1->getType() == PSNodeType::LOAD &&
                   "Invalid AtomicRMW nodes seq");
        }
    } else {
        op1 = getOperand(valOp);
    }

    PSNode *op2 = getOperand(Inst->getOperand(1));
    PSNode *node = PS.create<PSNodeType::STORE>(op1, op2);

    assert(node);
    return addNode(Inst, node);
}